

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

string * __thiscall
units::to_string_abi_cxx11_
          (string *__return_storage_ptr__,units *this,uncertain_measurement *measure,
          uint64_t match_flags)

{
  float fVar1;
  ostream *poVar2;
  uint64_t match_flags_00;
  precise_unit *un;
  uint64_t uVar3;
  uint uVar4;
  double dVar5;
  stringstream ss;
  string local_1d8;
  double local_1b8;
  undefined4 local_1b0;
  undefined4 local_1ac;
  long local_1a8;
  uint64_t uStack_1a0;
  ostream local_198 [112];
  ios_base local_128 [264];
  
  fVar1 = *(float *)this;
  uVar4 = -(uint)(fVar1 < -fVar1);
  dVar5 = log10((double)*(float *)(this + 4) /
                (double)(float)(~uVar4 & (uint)fVar1 | (uint)-fVar1 & uVar4));
  dVar5 = ceil(-dVar5);
  match_flags_00 = (long)dVar5 + 1;
  uVar3 = 2;
  if (1 < (long)dVar5) {
    uVar3 = match_flags_00;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a8);
  *(uint64_t *)((long)&uStack_1a0 + *(long *)(local_1a8 + -0x18)) = uVar3;
  std::ostream::_M_insert<double>((double)*(float *)this);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"+/-",3);
  *(undefined8 *)((long)&uStack_1a0 + *(long *)(local_1a8 + -0x18)) = 2;
  poVar2 = std::ostream::_M_insert<double>((double)*(float *)(this + 4));
  local_1d8._M_dataplus._M_p._0_1_ = 0x20;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_1d8,1);
  *(uint64_t *)((long)&uStack_1a0 + *(long *)(local_1a8 + -0x18)) = uVar3;
  local_1b0 = *(undefined4 *)(this + 0xc);
  local_1b8 = (double)*(float *)(this + 8);
  local_1ac = 0;
  to_string_abi_cxx11_(&local_1d8,(units *)&local_1b8,un,match_flags_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,
             (char *)CONCAT71(local_1d8._M_dataplus._M_p._1_7_,local_1d8._M_dataplus._M_p._0_1_),
             local_1d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1d8._M_dataplus._M_p._1_7_,local_1d8._M_dataplus._M_p._0_1_) !=
      &local_1d8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1d8._M_dataplus._M_p._1_7_,local_1d8._M_dataplus._M_p._0_1_),
                    local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string
    to_string(const uncertain_measurement& measure, std::uint64_t match_flags)
{
    // compute the correct number of digits to display for uncertain precision
    auto digits = static_cast<std::streamsize>(
        ceil(-log10(measure.fractional_uncertainty())));
    digits = (digits < 2) ? 2 : digits + 1;
    std::stringstream ss;
    ss.precision(digits);
    ss << measure.value_f();
    ss << "+/-";
    ss.precision(2);
    ss << measure.uncertainty_f() << ' ';
    ss.precision(digits);
    ss << to_string(measure.units(), match_flags);
    return ss.str();
}